

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O3

optional_ptr<duckdb::Transaction,_true> __thiscall
duckdb::MetaTransaction::TryGetTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  int iVar1;
  __node_base_ptr p_Var2;
  __hash_code __code;
  Transaction *pTVar3;
  key_type local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    local_20._M_data = db;
    p_Var2 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->transactions)._M_h,
                        (ulong)db % (this->transactions)._M_h._M_bucket_count,&local_20,
                        (__hash_code)db);
    if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
      pTVar3 = (Transaction *)0x0;
    }
    else {
      pTVar3 = (Transaction *)p_Var2->_M_nxt[2]._M_nxt;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return (optional_ptr<duckdb::Transaction,_true>)pTVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

optional_ptr<Transaction> MetaTransaction::TryGetTransaction(AttachedDatabase &db) {
	lock_guard<mutex> guard(lock);
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		return nullptr;
	} else {
		return &entry->second.get();
	}
}